

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t helper1(lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
                uint32_t position)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint8_t *puVar9;
  byte *pbVar10;
  ulong uVar11;
  uint local_100;
  uint local_f0;
  uint local_e0;
  uint local_dc;
  uint32_t cur_and_len_price_1;
  uint32_t dist;
  uint32_t i_3;
  uint32_t normal_match_price;
  uint32_t cur_and_len_price;
  uint32_t price;
  uint32_t rep_len;
  uint32_t i_2;
  uint32_t len;
  uint32_t i_1;
  uint32_t len_end;
  uint32_t short_rep_price;
  uint32_t rep_match_price;
  uint32_t match_price;
  uint32_t pos_state;
  uint8_t match_byte;
  uint8_t current_byte;
  uint8_t *buf_back;
  uint32_t i;
  uint32_t rep_max_index;
  uint32_t rep_lens [4];
  uint8_t *buf;
  uint32_t local_68;
  uint32_t buf_avail;
  uint32_t matches_count;
  uint32_t len_main;
  uint32_t nice_len;
  uint32_t position_local;
  uint32_t *len_res_local;
  uint32_t *back_res_local;
  lzma_mf *mf_local;
  lzma_lzma1_encoder *coder_local;
  ulong local_30;
  uint64_t x;
  byte *local_20;
  byte *local_18;
  uint local_c;
  
  matches_count = mf->nice_len;
  len_main = position;
  _nice_len = len_res;
  len_res_local = back_res;
  back_res_local = (uint32_t *)mf;
  mf_local = (lzma_mf *)coder;
  if (mf->read_ahead == 0) {
    buf_avail = lzma_mf_find(mf,&local_68,coder->matches);
  }
  else {
    if (mf->read_ahead != 1) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x11c,
                    "uint32_t helper1(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    buf_avail = coder->longest_match_length;
    local_68 = coder->matches_count;
  }
  uVar3 = mf_avail((lzma_mf *)back_res_local);
  if (uVar3 + 1 < 0x111) {
    uVar3 = mf_avail((lzma_mf *)back_res_local);
    local_dc = uVar3 + 1;
  }
  else {
    local_dc = 0x111;
  }
  if (local_dc < 2) {
    *len_res_local = 0xffffffff;
    *_nice_len = 1;
    coder_local._4_4_ = 0xffffffff;
  }
  else {
    puVar9 = mf_ptr((lzma_mf *)back_res_local);
    rep_lens._8_8_ = puVar9 + -1;
    buf_back._4_4_ = 0;
    for (buf_back._0_4_ = 0; (uint)buf_back < 4; buf_back._0_4_ = (uint)buf_back + 1) {
      pbVar10 = (byte *)(rep_lens._8_8_ + (-1 - (ulong)(&mf_local[6].offset)[(uint)buf_back]));
      if (*(short *)rep_lens._8_8_ == *(short *)pbVar10) {
        local_18 = (byte *)rep_lens._8_8_;
        local_20 = pbVar10;
        x._4_4_ = 2;
        x._0_4_ = local_dc;
        if (local_dc < 2) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if (0x7fffffff < local_dc) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
LAB_006c48df:
        if (x._4_4_ < local_dc) {
          uVar11 = *(long *)(rep_lens._8_8_ + (ulong)x._4_4_) - *(long *)(pbVar10 + x._4_4_);
          local_30 = uVar11;
          if (uVar11 == 0) goto LAB_006c4941;
          uVar4 = 0;
          for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
            uVar4 = uVar4 + 1;
          }
          local_e0 = (uVar4 >> 3) + x._4_4_;
          x._4_4_ = local_e0;
          if (local_dc <= local_e0) {
            local_e0 = local_dc;
          }
          local_c = local_e0;
        }
        else {
          local_c = local_dc;
        }
        (&i)[(uint)buf_back] = local_c;
        if ((&i)[buf_back._4_4_] < (&i)[(uint)buf_back]) {
          buf_back._4_4_ = (uint)buf_back;
        }
      }
      else {
        (&i)[(uint)buf_back] = 0;
      }
    }
    if ((&i)[buf_back._4_4_] < matches_count) {
      if (buf_avail < matches_count) {
        bVar1 = *(byte *)rep_lens._8_8_;
        bVar2 = puVar9[-2 - (ulong)mf_local[6].offset];
        if (((buf_avail < 2) && (bVar1 != bVar2)) && ((&i)[buf_back._4_4_] < 2)) {
          *len_res_local = 0xffffffff;
          *_nice_len = 1;
          coder_local._4_4_ = 0xffffffff;
        }
        else {
          mf_local[0x241].hash_count = mf_local[6].keep_size_after;
          uVar4 = len_main & mf_local[0x18].cyclic_pos;
          uVar3 = rc_bit_0_price(*(probability *)
                                  ((long)&mf_local[0xe5].hash +
                                  (ulong)uVar4 * 2 + (ulong)mf_local[6].keep_size_after * 0x20 + 4))
          ;
          uVar5 = get_literal_price((lzma_lzma1_encoder *)mf_local,len_main,
                                    (uint)*(byte *)(rep_lens._8_8_ + -1),
                                    (_Bool)((mf_local[6].keep_size_after < 7 ^ 0xffU) & 1),
                                    (uint)bVar2,(uint)bVar1);
          *(uint32_t *)&mf_local[0x242].find = uVar3 + uVar5;
          make_literal((lzma_optimal *)&mf_local[0x242].read_limit);
          uVar3 = rc_bit_1_price(*(probability *)
                                  ((long)&mf_local[0xe5].hash +
                                  (ulong)uVar4 * 2 + (ulong)mf_local[6].keep_size_after * 0x20 + 4))
          ;
          uVar5 = rc_bit_1_price(*(probability *)
                                  ((long)&mf_local[0xe8].depth +
                                  (ulong)mf_local[6].keep_size_after * 2));
          if (bVar2 == bVar1) {
            uVar6 = get_short_rep_price((lzma_lzma1_encoder *)mf_local,mf_local[6].keep_size_after,
                                        uVar4);
            uVar7 = uVar3 + uVar5 + uVar6;
            if (uVar7 < *(uint *)&mf_local[0x242].find) {
              *(uint *)&mf_local[0x242].find = uVar7;
              make_short_rep((lzma_optimal *)&mf_local[0x242].read_limit);
            }
          }
          if ((&i)[buf_back._4_4_] < buf_avail) {
            local_f0 = buf_avail;
          }
          else {
            local_f0 = (&i)[buf_back._4_4_];
          }
          if (local_f0 < 2) {
            *len_res_local = *(uint32_t *)&mf_local[0x242].skip;
            *_nice_len = 1;
            coder_local._4_4_ = 0xffffffff;
          }
          else {
            *(undefined4 *)((long)&mf_local[0x242].find + 4) = 0;
            for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
              (&mf_local[0x242].keep_size_after)[i_2] = (&mf_local[6].offset)[i_2];
            }
            rep_len = local_f0;
            do {
              *(undefined4 *)((long)&mf_local[0x242].buffer + (ulong)rep_len * 0x2c + 4) =
                   0x40000000;
              rep_len = rep_len - 1;
            } while (1 < rep_len);
            for (price = 0; price < 4; price = price + 1) {
              cur_and_len_price = (&i)[price];
              if (1 < cur_and_len_price) {
                uVar6 = get_pure_rep_price((lzma_lzma1_encoder *)mf_local,price,
                                           mf_local[6].keep_size_after,uVar4);
                do {
                  uVar8 = get_len_price((lzma_length_encoder *)&mf_local[0x18d].find,
                                        cur_and_len_price,uVar4);
                  uVar7 = uVar3 + uVar5 + uVar6 + uVar8;
                  if (uVar7 < *(uint *)((long)&mf_local[0x242].buffer +
                                       (ulong)cur_and_len_price * 0x2c + 4)) {
                    *(uint *)((long)&mf_local[0x242].buffer + (ulong)cur_and_len_price * 0x2c + 4) =
                         uVar7;
                    (&mf_local[0x242].size)[(ulong)cur_and_len_price * 0xb] = 0;
                    (&mf_local[0x242].keep_size_before)[(ulong)cur_and_len_price * 0xb] = price;
                    *(undefined1 *)(&mf_local[0x241].sons_count + (ulong)cur_and_len_price * 0xb) =
                         0;
                  }
                  cur_and_len_price = cur_and_len_price - 1;
                } while (1 < cur_and_len_price);
              }
            }
            uVar5 = rc_bit_0_price(*(probability *)
                                    ((long)&mf_local[0xe8].depth +
                                    (ulong)mf_local[6].keep_size_after * 2));
            if (i < 2) {
              local_100 = 2;
            }
            else {
              local_100 = i + 1;
            }
            rep_len = local_100;
            if (local_100 <= buf_avail) {
              cur_and_len_price_1 = 0;
              while ((&mf_local[6].write_pos)[(ulong)cur_and_len_price_1 * 2] < local_100) {
                cur_and_len_price_1 = cur_and_len_price_1 + 1;
              }
              while( true ) {
                uVar6 = (&mf_local[6].pending)[(ulong)cur_and_len_price_1 * 2];
                uVar8 = get_dist_len_price((lzma_lzma1_encoder *)mf_local,uVar6,rep_len,uVar4);
                uVar7 = uVar3 + uVar5 + uVar8;
                if (uVar7 < *(uint *)((long)&mf_local[0x242].buffer + (ulong)rep_len * 0x2c + 4)) {
                  *(uint *)((long)&mf_local[0x242].buffer + (ulong)rep_len * 0x2c + 4) = uVar7;
                  (&mf_local[0x242].size)[(ulong)rep_len * 0xb] = 0;
                  (&mf_local[0x242].keep_size_before)[(ulong)rep_len * 0xb] = uVar6 + 4;
                  *(undefined1 *)(&mf_local[0x241].sons_count + (ulong)rep_len * 0xb) = 0;
                }
                if ((rep_len == (&mf_local[6].write_pos)[(ulong)cur_and_len_price_1 * 2]) &&
                   (cur_and_len_price_1 = cur_and_len_price_1 + 1, cur_and_len_price_1 == local_68))
                break;
                rep_len = rep_len + 1;
              }
            }
            coder_local._4_4_ = local_f0;
          }
        }
      }
      else {
        *len_res_local = (&mf_local[6].pending)[(ulong)(local_68 - 1) * 2] + 4;
        *_nice_len = buf_avail;
        mf_skip((lzma_mf *)back_res_local,buf_avail - 1);
        coder_local._4_4_ = 0xffffffff;
      }
    }
    else {
      *len_res_local = buf_back._4_4_;
      *_nice_len = (&i)[buf_back._4_4_];
      mf_skip((lzma_mf *)back_res_local,*_nice_len - 1);
      coder_local._4_4_ = 0xffffffff;
    }
  }
  return coder_local._4_4_;
LAB_006c4941:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_006c48df;
}

Assistant:

static inline uint32_t
helper1(lzma_lzma1_encoder *restrict coder, lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;

	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	const uint32_t buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);
	if (buf_avail < 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return UINT32_MAX;
	}

	const uint8_t *const buf = mf_ptr(mf) - 1;

	uint32_t rep_lens[REPS];
	uint32_t rep_max_index = 0;

	for (uint32_t i = 0; i < REPS; ++i) {
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		if (not_equal_16(buf, buf_back)) {
			rep_lens[i] = 0;
			continue;
		}

		rep_lens[i] = lzma_memcmplen(buf, buf_back, 2, buf_avail);

		if (rep_lens[i] > rep_lens[rep_max_index])
			rep_max_index = i;
	}

	if (rep_lens[rep_max_index] >= nice_len) {
		*back_res = rep_max_index;
		*len_res = rep_lens[rep_max_index];
		mf_skip(mf, *len_res - 1);
		return UINT32_MAX;
	}


	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist + REPS;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return UINT32_MAX;
	}

	const uint8_t current_byte = *buf;
	const uint8_t match_byte = *(buf - coder->reps[0] - 1);

	if (len_main < 2 && current_byte != match_byte
			&& rep_lens[rep_max_index] < 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return UINT32_MAX;
	}

	coder->opts[0].state = coder->state;

	const uint32_t pos_state = position & coder->pos_mask;

	coder->opts[1].price = rc_bit_0_price(
				coder->is_match[coder->state][pos_state])
			+ get_literal_price(coder, position, buf[-1],
				!is_literal_state(coder->state),
				match_byte, current_byte);

	make_literal(&coder->opts[1]);

	const uint32_t match_price = rc_bit_1_price(
			coder->is_match[coder->state][pos_state]);
	const uint32_t rep_match_price = match_price
			+ rc_bit_1_price(coder->is_rep[coder->state]);

	if (match_byte == current_byte) {
		const uint32_t short_rep_price = rep_match_price
				+ get_short_rep_price(
					coder, coder->state, pos_state);

		if (short_rep_price < coder->opts[1].price) {
			coder->opts[1].price = short_rep_price;
			make_short_rep(&coder->opts[1]);
		}
	}

	const uint32_t len_end = my_max(len_main, rep_lens[rep_max_index]);

	if (len_end < 2) {
		*back_res = coder->opts[1].back_prev;
		*len_res = 1;
		return UINT32_MAX;
	}

	coder->opts[1].pos_prev = 0;

	for (uint32_t i = 0; i < REPS; ++i)
		coder->opts[0].backs[i] = coder->reps[i];

	uint32_t len = len_end;
	do {
		coder->opts[len].price = RC_INFINITY_PRICE;
	} while (--len >= 2);


	for (uint32_t i = 0; i < REPS; ++i) {
		uint32_t rep_len = rep_lens[i];
		if (rep_len < 2)
			continue;

		const uint32_t price = rep_match_price + get_pure_rep_price(
				coder, i, coder->state, pos_state);

		do {
			const uint32_t cur_and_len_price = price
					+ get_len_price(
						&coder->rep_len_encoder,
						rep_len, pos_state);

			if (cur_and_len_price < coder->opts[rep_len].price) {
				coder->opts[rep_len].price = cur_and_len_price;
				coder->opts[rep_len].pos_prev = 0;
				coder->opts[rep_len].back_prev = i;
				coder->opts[rep_len].prev_1_is_literal = false;
			}
		} while (--rep_len >= 2);
	}


	const uint32_t normal_match_price = match_price
			+ rc_bit_0_price(coder->is_rep[coder->state]);

	len = rep_lens[0] >= 2 ? rep_lens[0] + 1 : 2;
	if (len <= len_main) {
		uint32_t i = 0;
		while (len > coder->matches[i].len)
			++i;

		for(; ; ++len) {
			const uint32_t dist = coder->matches[i].dist;
			const uint32_t cur_and_len_price = normal_match_price
					+ get_dist_len_price(coder,
						dist, len, pos_state);

			if (cur_and_len_price < coder->opts[len].price) {
				coder->opts[len].price = cur_and_len_price;
				coder->opts[len].pos_prev = 0;
				coder->opts[len].back_prev = dist + REPS;
				coder->opts[len].prev_1_is_literal = false;
			}

			if (len == coder->matches[i].len)
				if (++i == matches_count)
					break;
		}
	}

	return len_end;
}